

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribfunction.cpp
# Opt level: O2

double __thiscall DistribFunction::getDistribSumSquares(DistribFunction *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2 = ZEXT816(0) << 0x40;
  uVar1 = 0;
  while ((uint)(~(this->numHistIntervals >> 0x1f) & this->numHistIntervals) != uVar1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->distrib[uVar1];
    uVar1 = uVar1 + 1;
    auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar3);
  }
  return auVar2._0_8_;
}

Assistant:

double DistribFunction::getDistribSumSquares( void ){
    double sumSquares = 0.0;
    for ( int i = 0; i < numHistIntervals; i++ ){
        sumSquares += distrib[i]*distrib[i];
    }
    return sumSquares; 
}